

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acceleration_stabilization.cpp
# Opt level: O0

int test(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Scalar *pSVar4;
  double dVar5;
  IndexedMatrixArray local_420 [88];
  Matrix local_3c8;
  uint local_3ac;
  undefined1 local_3a8 [4];
  uint k;
  undefined1 local_390 [8];
  Vector uk;
  undefined1 local_378 [4];
  uint j;
  undefined1 local_360 [8];
  Vector x0;
  DynamicalSystemSimulator sim;
  IMUFixedContactDynamicalSystem local_260 [8];
  IMUFixedContactDynamicalSystem imu;
  IndexedMatrixArray local_d8 [8];
  IndexedMatrixArray u;
  IndexedMatrixArray local_80 [8];
  IndexedMatrixArray x;
  uint i;
  uint inputSize;
  uint measurementSize;
  uint stateSize;
  double dt;
  uint kmax;
  
  bVar1 = false;
  while (!bVar1) {
    stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_80);
    stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_d8);
    stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
    IMUFixedContactDynamicalSystem(local_260,0.005);
    stateObservation::DynamicalSystemSimulator::DynamicalSystemSimulator
              ((DynamicalSystemSimulator *)
               &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    stateObservation::DynamicalSystemSimulator::setDynamicsFunctor
              ((DynamicalSystemFunctorBase *)
               &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              ((ConstantReturnType *)local_378,0x12,1);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_360,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_378);
    for (uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
              0; uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                 _4_4_ < 0x12;
        uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
             uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
             _4_4_ + 1) {
      iVar2 = rand();
      dVar5 = (double)iVar2 / 2147483647.0 + -0.5;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_360,
                          (ulong)uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows._4_4_);
      *pSVar4 = dVar5 + dVar5;
    }
    stateObservation::DynamicalSystemSimulator::setState
              ((Matrix *)
               &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (uint)local_360);
    uVar3 = stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::getInputSize();
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              ((ConstantReturnType *)local_3a8,(ulong)uVar3,1);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_390,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_3a8);
    for (local_3ac = 0; local_3ac < 2000; local_3ac = local_3ac + 1) {
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_3c8,
                 (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_390);
      stateObservation::IndexedMatrixArray::setValue(local_d8,&local_3c8,local_3ac);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_3c8);
      stateObservation::DynamicalSystemSimulator::setInput
                ((Matrix *)
                 &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 ,(uint)local_390);
    }
    stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::setSamplingPeriod
              (0.005);
    stateObservation::DynamicalSystemSimulator::simulateDynamicsTo((int)&x0 + 8);
    stateObservation::DynamicalSystemSimulator::getStateArray((uint)local_420,(int)&x0 + 8);
    stateObservation::IndexedMatrixArray::operator=(local_80,local_420);
    stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_420);
    stateObservation::IndexedMatrixArray::writeInFile((char *)local_80);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_390);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_360);
    stateObservation::DynamicalSystemSimulator::~DynamicalSystemSimulator
              ((DynamicalSystemSimulator *)
               &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
    ~IMUFixedContactDynamicalSystem(local_260);
    stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_d8);
    stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_80);
    bVar1 = true;
  }
  return 0;
}

Assistant:

int test()
{
    /// The number of samples
    const unsigned kmax=2000;

    ///sampling period
    const double dt=5e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=15;
    (void)measurementSize;
    (void)inputSize;


    for (unsigned i = 0; i<1; ++i)
    {
    	///The array containing all the states, the measurements and the inputs
    	IndexedMatrixArray x;
    	IndexedMatrixArray u;

        ///simulation of the signal
        /// the IMU dynamical system functor
        flexibilityEstimation::IMUFixedContactDynamicalSystem imu(dt);

        ///the simulator initalization
        DynamicalSystemSimulator sim;
        sim.setDynamicsFunctor( & imu); // choice of the dynamical system

        Vector x0=(Vector::Zero(stateSize,1));

        ///initialization of the state vector
        for (unsigned j= 0; j<stateSize ;++j)
        	x0[j]=(double(rand())/RAND_MAX -0.5)*2;

        sim.setState(x0,0);

        Vector uk=Vector::Zero(imu.getInputSize(),1);


        for (unsigned k=0;k<kmax;++k)
        {
        	u.setValue(uk,k);

            ///give the input to the simulator
            ///we only need to give one value and the
            ///simulator takes automatically the appropriate value
            sim.setInput(uk,k);
        }

        ///set the sampling perdiod to the functor
        imu.setSamplingPeriod(dt);

        sim.simulateDynamicsTo(kmax);

        x = sim.getStateArray(1,kmax);

        x.writeInFile("state.dat");
        //std::cout <<x[kmax].norm ()<< " "<< x[kmax].transpose() << std::endl;
    }

    return 0;

}